

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

int_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::get(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      *this)

{
  int iVar1;
  int_type iVar2;
  element_type *peVar3;
  value_type_conflict *__x;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
  *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + 1;
  if ((*(byte *)(in_RDI + 0x14) & 1) == 0) {
    peVar3 = std::
             __shared_ptr_access<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x12dd86);
    iVar1 = (**peVar3->_vptr_input_adapter_protocol)();
    *(int *)(in_RDI + 0x10) = iVar1;
  }
  else {
    *(undefined1 *)(in_RDI + 0x14) = 0;
  }
  iVar1 = *(int *)(in_RDI + 0x10);
  iVar2 = std::char_traits<char>::eof();
  if (iVar1 != iVar2) {
    __x = (value_type_conflict *)(in_RDI + 0x30);
    std::char_traits<char>::to_char_type((int_type *)(in_RDI + 0x10));
    std::vector<char,_std::allocator<char>_>::push_back
              ((vector<char,_std::allocator<char>_> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),__x)
    ;
  }
  if (*(int *)(in_RDI + 0x10) == 10) {
    *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 1;
    *(undefined8 *)(in_RDI + 0x20) = 0;
  }
  return *(int_type *)(in_RDI + 0x10);
}

Assistant:

std::char_traits<char>::int_type get()
    {
        ++position.chars_read_total;
        ++position.chars_read_current_line;

        if (next_unget)
        {
            // just reset the next_unget variable and work with current
            next_unget = false;
        }
        else
        {
            current = ia->get_character();
        }

        if (JSON_HEDLEY_LIKELY(current != std::char_traits<char>::eof()))
        {
            token_string.push_back(std::char_traits<char>::to_char_type(current));
        }

        if (current == '\n')
        {
            ++position.lines_read;
            position.chars_read_current_line = 0;
        }

        return current;
    }